

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O3

bool sptk::MakePseudoQuadratureMirrorFilterBanks
               (bool inverse,int num_subband,int num_filter_order,double attenuation,
               int num_iteration,double convergence_threshold,double initial_step_size,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *filter_banks,bool *is_converged)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  pointer pdVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int n;
  ulong uVar11;
  uint uVar12;
  int n_1;
  ulong uVar13;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> real;
  vector<double,_std::allocator<double>_> ideal_filter;
  vector<double,_std::allocator<double>_> prototype_filter;
  vector<double,_std::allocator<double>_> imag;
  Buffer buffer_for_fft;
  KaiserWindow kaiser_window;
  RealValuedFastFourierTransform fft;
  double local_1e0;
  undefined1 local_1b8 [16];
  undefined1 local_198 [16];
  vector<double,_std::allocator<double>_> local_188;
  ulong local_168;
  ulong local_160;
  vector<double,_std::allocator<double>_> local_158;
  vector<double,_std::allocator<double>_> local_140;
  vector<double,_std::allocator<double>_> local_128;
  Buffer local_108;
  KaiserWindow local_d0;
  RealValuedFastFourierTransform local_98;
  ulong __n;
  
  local_198._8_4_ = in_XMM2_Dc;
  local_198._0_8_ = initial_step_size;
  local_198._12_4_ = in_XMM2_Dd;
  if ((filter_banks ==
       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)0x0 || initial_step_size <= 0.0) ||
      (convergence_threshold < 0.0 ||
      ((num_iteration == 0 || (num_filter_order < 2 || num_subband == 0)) || attenuation <= 0.0))) {
    bVar6 = false;
  }
  else {
    uVar11 = (ulong)(uint)num_subband;
    if (is_converged != (bool *)0x0) {
      *is_converged = false;
    }
    uVar12 = num_filter_order + 1;
    __n = (ulong)uVar12;
    std::vector<double,_std::allocator<double>_>::vector(&local_140,__n,(allocator_type *)&local_98)
    ;
    dVar2 = KaiserWindow::AttenuationToBeta(attenuation);
    KaiserWindow::KaiserWindow(&local_d0,uVar12,dVar2,false);
    iVar7 = NextPowTwo(uVar12);
    RealValuedFastFourierTransform::RealValuedFastFourierTransform(&local_98,num_filter_order,iVar7)
    ;
    local_108._vptr_Buffer = (_func_int **)&PTR__Buffer_0011fbb0;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_98.is_valid_ == false) {
      bVar6 = false;
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_158,__n,(allocator_type *)&local_188);
      iVar9 = 0;
      local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if (num_iteration < 1) {
        bVar6 = true;
      }
      else {
        local_1b8._8_8_ = 0;
        local_1b8._0_8_ = 3.141592653589793 / (double)(num_subband * 2);
        iVar7 = iVar7 / (num_subband * 4);
        local_1e0 = 1.79769313486232e+308;
        local_168 = uVar11;
        local_160 = (ulong)(uint)num_filter_order;
        do {
          pdVar5 = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            dVar3 = (double)(int)uVar11 + (double)num_filter_order * -0.5;
            dVar2 = sin((double)local_1b8._0_8_ * dVar3);
            pdVar5[uVar11] = dVar2 / (dVar3 * 3.141592653589793);
            uVar11 = uVar11 + 1;
          } while (__n != uVar11);
          bVar6 = IsEven(uVar12);
          if (!bVar6) {
            pdVar5[(uint)num_filter_order >> 1] = (double)local_1b8._0_8_ / 3.141592653589793;
          }
          if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar8 = 0;
            do {
              pdVar1 = (double *)
                       ((long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar8);
              *(double *)
               ((long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar8) =
                   *pdVar1 * *(double *)
                              ((long)local_d0.window_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar8);
              lVar8 = lVar8 + 8;
            } while (pdVar1 + 1 !=
                     local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          }
          bVar6 = RealValuedFastFourierTransform::Run
                            (&local_98,&local_140,&local_188,&local_128,&local_108);
          if (!bVar6) {
            if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) {
              bVar6 = false;
              goto LAB_0010e446;
            }
            break;
          }
          dVar3 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7] *
                  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7] +
                  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7] *
                  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7] + -0.5;
          dVar2 = ABS(dVar3);
          if (dVar2 < convergence_threshold) {
            if (is_converged != (bool *)0x0) {
              *is_converged = true;
            }
            break;
          }
          auVar15._0_8_ = (ulong)local_198._0_8_ & -(ulong)(dVar2 < local_1e0);
          auVar15._8_8_ = 0;
          auVar4._8_4_ = local_198._8_4_;
          auVar4._0_8_ = ~-(ulong)(dVar2 < local_1e0) & (ulong)(local_198._0_8_ * 0.5);
          auVar4._12_4_ = local_198._12_4_;
          local_198 = auVar15 | auVar4;
          if (local_1e0 <= dVar2) {
            dVar2 = local_1e0;
          }
          local_1e0 = dVar2;
          uVar14 = local_1b8._12_4_;
          local_1b8._8_4_ = local_1b8._8_4_;
          local_1b8._0_8_ =
               (double)local_1b8._0_8_ +
               local_198._0_8_ * *(double *)(&DAT_00117ce0 + (ulong)(0.0 < dVar3) * 8);
          local_1b8._12_4_ = uVar14;
          iVar9 = iVar9 + 1;
        } while (iVar9 != num_iteration);
        operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_0010e446:
        num_filter_order = (int)local_160;
        uVar11 = local_168;
      }
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    RealValuedFastFourierTransform::Buffer::~Buffer(&local_108);
    RealValuedFastFourierTransform::~RealValuedFastFourierTransform(&local_98);
    local_d0.super_WindowInterface._vptr_WindowInterface = (_func_int **)&PTR__KaiserWindow_0011fc40
    ;
    if (local_d0.window_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.window_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (bVar6 != false) {
      iVar7 = (int)uVar11;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(filter_banks,(long)iVar7);
      if (0 < iVar7) {
        uVar12 = -(uint)inverse | 1;
        uVar10 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((filter_banks->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar10,__n);
          pdVar5 = local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar8 = *(long *)&(filter_banks->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data;
          uVar13 = 0;
          do {
            dVar2 = pdVar5[uVar13];
            dVar3 = cos(((double)(int)uVar13 + (double)num_filter_order * -0.5) *
                        (((double)((int)uVar10 * 2 + 1) * 3.141592653589793) / (double)(iVar7 * 2))
                        + (double)(int)uVar12 * 0.25 * 3.141592653589793);
            *(double *)(lVar8 + uVar13 * 8) = dVar3 * (dVar2 + dVar2);
            uVar13 = uVar13 + 1;
          } while (__n != uVar13);
          uVar12 = -uVar12;
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uVar11 & 0xffffffff));
      }
    }
    if (local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar6;
}

Assistant:

bool MakePseudoQuadratureMirrorFilterBanks(
    bool inverse, int num_subband, int num_filter_order, double attenuation,
    int num_iteration, double convergence_threshold, double initial_step_size,
    std::vector<std::vector<double> >* filter_banks, bool* is_converged) {
  if (0 == num_subband || num_filter_order <= 1 || attenuation <= 0.0 ||
      0 == num_iteration || convergence_threshold < 0.0 ||
      initial_step_size <= 0.0 || NULL == filter_banks) {
    return false;
  }

  if (is_converged) *is_converged = false;

  // Design prototype filter.
  const int filter_size(num_filter_order + 1);
  std::vector<double> prototype_filter(filter_size);
  {
    // Make Kaiser window.
    const sptk::KaiserWindow kaiser_window(
        filter_size, sptk::KaiserWindow::AttenuationToBeta(attenuation), false);
    const std::vector<double>& window(kaiser_window.Get());

    // Prepare FFT.
    const int fft_size(sptk::NextPowTwo(filter_size));
    sptk::RealValuedFastFourierTransform fft(num_filter_order, fft_size);
    sptk::RealValuedFastFourierTransform::Buffer buffer_for_fft;
    if (!fft.IsValid()) {
      return false;
    }

    std::vector<double> ideal_filter(filter_size);
    std::vector<double> real;
    std::vector<double> imag;
    const int index(fft_size / (4 * num_subband));

    // Initialize.
    double omega(sptk::kPi / (2 * num_subband));
    double step_size(initial_step_size);
    double best_abs_error(sptk::kMax);

    for (int i(0); i < num_iteration; ++i) {
      // Make ideal filter.
      {
        double* h(&(ideal_filter[0]));
        for (int n(0); n < filter_size; ++n) {
          const double x(n - 0.5 * num_filter_order);
          h[n] = std::sin(omega * x) / (sptk::kPi * x);
        }
        // Avoid NaN using L'Hopital's rule.
        if (!sptk::IsEven(filter_size))
          h[num_filter_order / 2] = omega / sptk::kPi;
      }

      // Make prototype filter.
      std::transform(ideal_filter.begin(), ideal_filter.end(), window.begin(),
                     prototype_filter.begin(),
                     [](double h, double w) { return h * w; });

      // Get frequency response of the prototype filter.
      if (!fft.Run(prototype_filter, &real, &imag, &buffer_for_fft)) {
        return false;
      }

      // Calculate error.
      const double error(real[index] * real[index] + imag[index] * imag[index] -
                         0.5);
      const double abs_error(std::fabs(error));
      if (abs_error < convergence_threshold) {
        if (is_converged) *is_converged = true;
        break;
      }

      // Update angular frequency.
      const int sign((0 < error) ? -1 : 1);
      if (abs_error < best_abs_error) {
        omega += sign * step_size;
        best_abs_error = abs_error;
      } else {
        step_size *= 0.5;  // Drop step size by half (heuristic).
        omega += sign * step_size;
      }
    }
  }

  // Make filter banks.
  {
    filter_banks->resize(num_subband);
    int sign(inverse ? -1 : 1);
    for (int k(0); k < num_subband; ++k) {
      (*filter_banks)[k].resize(filter_size);
      const double* p(&(prototype_filter[0]));
      double* h(&((*filter_banks)[k][0]));
      for (int n(0); n < filter_size; ++n) {
        const double a((2 * k + 1) * sptk::kPi / (2 * num_subband) *
                       (n - 0.5 * num_filter_order));
        const double b(sign * 0.25 * sptk::kPi);
        const double c(2.0 * p[n]);
        h[n] = c * std::cos(a + b);
      }
      sign *= -1;
    }
  }
  return true;
}